

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<Catch::TestSpec,void>
          (XmlWriter *this,StringRef name,TestSpec *attribute)

{
  ReusableStringStream rss;
  ReusableStringStream RStack_58;
  StringRef local_48 [2];
  
  ReusableStringStream::ReusableStringStream(&RStack_58);
  TestSpec::serializeTo(attribute,RStack_58.m_oss);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,local_48[0]);
  std::__cxx11::string::~string((string *)local_48);
  ReusableStringStream::~ReusableStringStream(&RStack_58);
  return this;
}

Assistant:

XmlWriter& writeAttribute( StringRef name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }